

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

bool __thiscall
Diligent::ThreadPoolImpl::ProcessTask(ThreadPoolImpl *this,Uint32 ThreadId,bool WaitForTask)

{
  atomic<int> *paVar1;
  __int_type_conflict1 _Var2;
  iterator __position;
  pointer pRVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  pointer pRVar8;
  bool bVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float local_8c;
  QueuedTaskInfo TaskInfo;
  unique_lock<std::mutex> lock;
  float local_34;
  
  TaskInfo.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  TaskInfo.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TaskInfo.pTask.m_pObject = (IAsyncTask *)0x0;
  TaskInfo.Prerequisites.
  super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_TasksQueueMtx);
  if (WaitForTask) {
    std::condition_variable::
    wait<Diligent::ThreadPoolImpl::ProcessTask(unsigned_int,bool)::_lambda()_1_>
              (&this->m_NextTaskCond,&lock,(anon_class_8_1_8991fb9c)this);
  }
  _Var2 = (this->m_Stop)._M_base._M_i;
  bVar9 = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  if (!bVar9) {
    __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    QueuedTaskInfo::operator=(&TaskInfo,(QueuedTaskInfo *)&__position._M_node[1]._M_parent);
    LOCK();
    (this->m_NumRunningTasks).super___atomic_base<int>._M_i =
         (this->m_NumRunningTasks).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    std::
    _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                        *)&this->m_TasksQueue,__position);
  }
  bVar7 = bVar9 & _Var2;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  pRVar3 = TaskInfo.Prerequisites.
           super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (TaskInfo.pTask.m_pObject == (IAsyncTask *)0x0 || bVar7 != 0) goto LAB_0061442a;
  bVar9 = true;
  local_8c = 3.4028235e+38;
  for (pRVar8 = TaskInfo.Prerequisites.
                super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar8 != pRVar3; pRVar8 = pRVar8 + 1) {
    RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)&lock);
    if (lock._M_device != (mutex_type *)0x0) {
      cVar4 = (**(code **)(((lock._M_device)->super___mutex_base)._M_mutex.__align + 0x50))();
      if (cVar4 == '\0') {
        fVar10 = (float)(**(code **)(((lock._M_device)->super___mutex_base)._M_mutex.__align + 0x48)
                        )();
        if (local_8c <= fVar10) {
          fVar10 = local_8c;
        }
        bVar9 = false;
        local_8c = fVar10;
      }
    }
    RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)&lock);
  }
  if (bVar9) {
    (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[6])(TaskInfo.pTask.m_pObject,2);
    uVar5 = (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[4])
                      (TaskInfo.pTask.m_pObject,(ulong)ThreadId);
    (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[6])
              (TaskInfo.pTask.m_pObject,(ulong)uVar5);
    iVar6 = (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[10])();
    bVar9 = true;
    if ((char)iVar6 == '\0') {
      iVar6 = (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[7])();
      if (iVar6 != 1) {
        FormatString<char[67]>
                  ((string *)&lock,
                   (char (*) [67])
                   "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
        DebugAssertionFailed
                  ((Char *)lock._M_device,"ProcessTask",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
                   ,0x8d);
        std::__cxx11::string::~string((string *)&lock);
      }
      goto LAB_0061438a;
    }
  }
  else {
LAB_0061438a:
    bVar9 = false;
  }
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_TasksQueueMtx);
  LOCK();
  paVar1 = &this->m_NumRunningTasks;
  iVar6 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (bVar9) {
    if ((iVar6 == 1) && ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
       ) {
      std::condition_variable::notify_one();
    }
  }
  else {
    (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[9])();
    if (local_8c < extraout_XMM0_Da) {
      (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[8])(local_8c);
    }
    (*((TaskInfo.pTask.m_pObject)->super_IObject)._vptr_IObject[9])();
    std::
    _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
    ::_M_emplace_equal<float,Diligent::ThreadPoolImpl::QueuedTaskInfo>
              ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                *)&this->m_TasksQueue,&local_34,&TaskInfo);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  if (!bVar9) {
    std::condition_variable::notify_one();
  }
LAB_0061442a:
  QueuedTaskInfo::~QueuedTaskInfo(&TaskInfo);
  return (bool)(bVar7 ^ 1);
}

Assistant:

ProcessTask(Uint32 ThreadId, bool WaitForTask) override final
    {
        QueuedTaskInfo TaskInfo;
        {
            std::unique_lock<std::mutex> lock{m_TasksQueueMtx};
            if (WaitForTask)
            {
                // The effects of notify_one()/notify_all() and each of the three atomic parts of
                // wait()/wait_for()/wait_until() (unlock+wait, wakeup, and lock) take place in a
                // single total order that can be viewed as modification order of an atomic variable:
                // the order is specific to this individual condition variable. This makes it impossible
                // for notify_one() to, for example, be delayed and unblock a thread that started waiting
                // just after the call to notify_one() was made.
                m_NextTaskCond.wait(lock,
                                    [this] //
                                    {
                                        return m_Stop.load() || !m_TasksQueue.empty();
                                    } //
                );
            }

            // m_Stop must be accessed under the mutex
            if (m_Stop.load() && m_TasksQueue.empty())
                return false;

            if (!m_TasksQueue.empty())
            {
                auto front = m_TasksQueue.begin();
                TaskInfo   = std::move(front->second);
                // NB: we must increment the running task counter while holding the lock and
                //     before removing the task from the queue, otherwise WaitForAllTasks() may
                //     miss the task.
                m_NumRunningTasks.fetch_add(1);
                m_TasksQueue.erase(front);
            }
        }

        if (TaskInfo.pTask)
        {
            // Check prerequisites
            bool  PrerequisitesMet  = true;
            float MinPrereqPriority = +FLT_MAX;
            for (auto& pPrereq : TaskInfo.Prerequisites)
            {
                if (auto pPrereqTask = pPrereq.Lock())
                {
                    if (!pPrereqTask->IsFinished())
                    {
                        PrerequisitesMet  = false;
                        MinPrereqPriority = std::min(MinPrereqPriority, pPrereqTask->GetPriority());
                    }
                }
            }

            bool TaskFinished = false;
            if (PrerequisitesMet)
            {
                TaskInfo.pTask->SetStatus(ASYNC_TASK_STATUS_RUNNING);
                ASYNC_TASK_STATUS ReturnStatus = TaskInfo.pTask->Run(ThreadId);
                // NB: It is essential to set the task status after the Run() method returns.
                //     This way if the GetStatus() method returns any value other than ASYNC_TASK_STATUS_RUNNING,
                //     it is guaranteed that the task is not executed by any thread.
                TaskInfo.pTask->SetStatus(ReturnStatus);
                TaskFinished = TaskInfo.pTask->IsFinished();
                DEV_CHECK_ERR((TaskFinished || TaskInfo.pTask->GetStatus() == ASYNC_TASK_STATUS_NOT_STARTED),
                              "Finished tasks must be in COMPLETE, CANCELLED or NOT_STARTED state");
            }

            {
                std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

                const auto NumRunningTasks = m_NumRunningTasks.fetch_add(-1) - 1;

                if (TaskFinished)
                {
                    if (m_TasksQueue.empty() && NumRunningTasks == 0)
                    {
                        m_TasksFinishedCond.notify_one();
                    }
                }
                else
                {
                    // If prerequisites are not met or the task requested to be re-run,
                    // re-enqueue the task with the minimum prerequisite priority
                    if (TaskInfo.pTask->GetPriority() > MinPrereqPriority)
                        TaskInfo.pTask->SetPriority(MinPrereqPriority);
                    m_TasksQueue.emplace(TaskInfo.pTask->GetPriority(), std::move(TaskInfo));
                }
            }

            if (!TaskFinished)
            {
                m_NextTaskCond.notify_one();
            }
        }

        return true;
    }